

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeTest.cpp
# Opt level: O0

void __thiscall
NodeTest_testCollidedTriangleVsDot_Test::~NodeTest_testCollidedTriangleVsDot_Test
          (NodeTest_testCollidedTriangleVsDot_Test *this)

{
  NodeTest_testCollidedTriangleVsDot_Test *this_local;
  
  ~NodeTest_testCollidedTriangleVsDot_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(NodeTest, testCollidedTriangleVsDot)
{
    TVertices vertices1 =
    {
        {3, 1, 0},
        {1, 5, 0},
        {5, 4, 0}
    };

    TVertices vertices2 =
    {
        {4, 5, 0}
    };

    auto root1 = buildTree<TKDop16>(vertices1);
    auto root2 = buildTree<TKDop16>(vertices2);

    TNodeKDop16::TCollidedNodes output;
    bool found = root1->collided(root2, output);

    EXPECT_TRUE(found);
    EXPECT_EQ(1, output.size());
    EXPECT_EQ(3, output[0].first->getVertices().size());
    EXPECT_EQ(SVertex(3, 1, 0), output[0].first->getVertices()[0]);
    EXPECT_EQ(SVertex(1, 5, 0), output[0].first->getVertices()[1]);
    EXPECT_EQ(SVertex(5, 4, 0), output[0].first->getVertices()[2]);
    EXPECT_EQ(1, output[0].second->getVertices().size());
    EXPECT_EQ(SVertex(4, 5, 0), output[0].second->getVertices()[0]);
}